

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simulator.h
# Opt level: O0

void __thiscall Simulator::pop_identity(Simulator *this,PCode *code)

{
  Symbol *pSVar1;
  Type TVar2;
  Type TVar3;
  reference pvVar4;
  string *name;
  int *piVar5;
  double *pdVar6;
  simulator_error *psVar7;
  allocator local_109;
  string local_108;
  int local_e8;
  undefined1 local_e2;
  allocator local_e1;
  string local_e0;
  int local_bc;
  double local_b8;
  double local_b0;
  undefined1 local_a2;
  allocator local_a1;
  string local_a0;
  int local_80;
  int local_7c;
  int local_78 [4];
  Symbol *local_68;
  Symbol *symbol;
  StackSymbol back;
  PCode *code_local;
  Simulator *this_local;
  
  back.value_.real_array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)code;
  pvVar4 = std::deque<StackSymbol,_std::allocator<StackSymbol>_>::back(&this->stack_);
  StackSymbol::StackSymbol((StackSymbol *)&symbol,pvVar4);
  std::deque<StackSymbol,_std::allocator<StackSymbol>_>::pop_back(&this->stack_);
  name = PCode::first_abi_cxx11_
                   ((PCode *)back.value_.real_array.
                             super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage);
  local_68 = ScopeTree::resolve(&this->tree_,name);
  TVar2 = Symbol::type(local_68);
  if (TVar2 == kInt) {
    TVar3 = StackSymbol::type((StackSymbol *)&symbol);
    pSVar1 = local_68;
    if (TVar3 == kInt) {
      piVar5 = StackSymbol::int_value((StackSymbol *)&symbol);
      local_78[0] = *piVar5;
      Symbol::set_value(pSVar1,local_78);
    }
    else {
      TVar3 = StackSymbol::type((StackSymbol *)&symbol);
      pSVar1 = local_68;
      if (TVar3 != kReal) {
        local_a2 = 1;
        psVar7 = (simulator_error *)__cxa_allocate_exception(0x30);
        local_80 = eip(this);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_a0,anon_var_dwarf_a220,&local_a1);
        simulator_error::simulator_error(psVar7,&local_80,&local_a0);
        local_a2 = 0;
        __cxa_throw(psVar7,&simulator_error::typeinfo,simulator_error::~simulator_error);
      }
      pdVar6 = StackSymbol::real_value((StackSymbol *)&symbol);
      local_7c = (int)*pdVar6;
      Symbol::set_value(pSVar1,&local_7c);
    }
  }
  else {
    TVar2 = Symbol::type(local_68);
    if (TVar2 != kReal) {
      psVar7 = (simulator_error *)__cxa_allocate_exception(0x30);
      local_e8 = eip(this);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_108,anon_var_dwarf_a237,&local_109);
      simulator_error::simulator_error(psVar7,&local_e8,&local_108);
      __cxa_throw(psVar7,&simulator_error::typeinfo,simulator_error::~simulator_error);
    }
    TVar3 = StackSymbol::type((StackSymbol *)&symbol);
    pSVar1 = local_68;
    if (TVar3 == kInt) {
      piVar5 = StackSymbol::int_value((StackSymbol *)&symbol);
      local_b0 = (double)*piVar5;
      Symbol::set_value(pSVar1,&local_b0);
    }
    else {
      TVar3 = StackSymbol::type((StackSymbol *)&symbol);
      pSVar1 = local_68;
      if (TVar3 != kReal) {
        local_e2 = 1;
        psVar7 = (simulator_error *)__cxa_allocate_exception(0x30);
        local_bc = eip(this);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_e0,anon_var_dwarf_a220,&local_e1);
        simulator_error::simulator_error(psVar7,&local_bc,&local_e0);
        local_e2 = 0;
        __cxa_throw(psVar7,&simulator_error::typeinfo,simulator_error::~simulator_error);
      }
      pdVar6 = StackSymbol::real_value((StackSymbol *)&symbol);
      local_b8 = *pdVar6;
      Symbol::set_value(pSVar1,&local_b8);
    }
  }
  Symbol::set_assigned(local_68);
  inc_eip(this);
  StackSymbol::~StackSymbol((StackSymbol *)&symbol);
  return;
}

Assistant:

void Simulator::pop_identity(const PCode &code) {
    StackSymbol back = stack_.back();
    stack_.pop_back();
    Symbol &symbol = tree_.resolve(code.first());

    if (symbol.type() == Symbol::Type::kInt) {
        if (back.type() == StackSymbol::Type::kInt) {
            symbol.set_value((int) back.int_value());
        } else if (back.type() == StackSymbol::Type::kReal) {
            symbol.set_value((int) back.real_value());
        } else {
            throw simulator_error(eip(), "无法取出栈顶元素");
        }
    } else if (symbol.type() == Symbol::Type::kReal) {
        if (back.type() == StackSymbol::Type::kInt) {
            symbol.set_value((double) back.int_value());
        } else if (back.type() == StackSymbol::Type::kReal) {
            symbol.set_value((double) back.real_value());
        } else {
            throw simulator_error(eip(), "无法取出栈顶元素");
        }
    } else {
        throw simulator_error(eip(), "错误的目标类型");
    }

    symbol.set_assigned();

    inc_eip();
}